

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
NoiseModel_InitFailsWithInvalidBitdepth_Test::TestBody
          (NoiseModel_InitFailsWithInvalidBitdepth_Test *this)

{
  aom_noise_model_params_t params_00;
  aom_noise_model_params_t params_01;
  aom_noise_model_params_t params_02;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  Message *pMVar4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i;
  aom_noise_model_params_t params;
  aom_noise_model_t model;
  char (*in_stack_fffffffffffffba8) [12];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  Message *in_stack_fffffffffffffbc0;
  aom_noise_model_t *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  Type in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  string local_408 [24];
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  AssertionResult *in_stack_fffffffffffffc28;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_fffffffffffffc30;
  AssertHelper *this_01;
  AssertionResult local_3b8;
  string local_3a8 [48];
  AssertionResult *local_378;
  double *pdStack_370;
  undefined1 local_359;
  undefined1 local_358 [80];
  AssertionResult *local_308;
  double *pdStack_300;
  int local_2f4;
  AssertionResult local_2f0;
  int local_2dc;
  AssertionResult *local_2d8;
  AssertHelper *pAStack_2d0;
  
  local_2d8 = (AssertionResult *)0x200000001;
  pAStack_2d0 = (AssertHelper *)0x0;
  for (local_2dc = 0; local_2dc < 0x21; local_2dc = local_2dc + 1) {
    pAStack_2d0 = (AssertHelper *)CONCAT44(pAStack_2d0._4_4_,local_2dc);
    if (((local_2dc == 8) || (local_2dc == 10)) || (local_2dc == 0xc)) {
      local_308 = local_2d8;
      pdStack_300 = (double *)pAStack_2d0;
      params_00.lag = in_stack_fffffffffffffbd8;
      params_00._0_4_ = in_stack_fffffffffffffbd4;
      params_00.bit_depth = in_stack_fffffffffffffbdc;
      params_00.use_highbd = in_stack_fffffffffffffbe0;
      local_2f4 = aom_noise_model_init(in_stack_fffffffffffffbc8,params_00);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                 (int *)in_stack_fffffffffffffba8,(type *)0x5a1348);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        pMVar4 = testing::Message::operator<<
                           ((Message *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0)
                            ,in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbe0 = (int)pMVar4;
        in_stack_fffffffffffffbe4 = (undefined4)((ulong)pMVar4 >> 0x20);
        pMVar4 = testing::Message::operator<<
                           ((Message *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0)
                            ,(int *)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbd8 = SUB84(pMVar4,0);
        in_stack_fffffffffffffbdc = (Type)((ulong)pMVar4 >> 0x20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                   in_stack_fffffffffffffc10);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   in_stack_fffffffffffffbdc,
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc30,(Message *)in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
        std::__cxx11::string::~string((string *)(local_358 + 0x10));
        testing::Message::~Message((Message *)0x5a145a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a14d2);
      aom_noise_model_free
                ((aom_noise_model_t *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0))
      ;
    }
    else {
      local_378 = local_2d8;
      pdStack_370 = (double *)pAStack_2d0;
      params_01.lag = in_stack_fffffffffffffbd8;
      params_01._0_4_ = in_stack_fffffffffffffbd4;
      params_01.bit_depth = in_stack_fffffffffffffbdc;
      params_01.use_highbd = in_stack_fffffffffffffbe0;
      iVar3 = aom_noise_model_init(in_stack_fffffffffffffbc8,params_01);
      local_359 = iVar3 == 0;
      in_stack_fffffffffffffbc8 = (aom_noise_model_t *)local_358;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                 (bool *)in_stack_fffffffffffffba8,(type *)0x5a154b);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbd4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbd4);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffbc0 =
             testing::Message::operator<<
                       ((Message *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                        in_stack_fffffffffffffba8);
        testing::Message::operator<<
                  ((Message *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   (int *)in_stack_fffffffffffffba8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                   in_stack_fffffffffffffc10);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   in_stack_fffffffffffffbdc,
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc30,(Message *)in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
        std::__cxx11::string::~string(local_3a8);
        testing::Message::~Message((Message *)0x5a165d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a16d5);
    }
  }
  pAStack_2d0 = (AssertHelper *)CONCAT44(pAStack_2d0._4_4_,0x7fffffff);
  params_02.lag = in_stack_fffffffffffffbd8;
  params_02._0_4_ = in_stack_fffffffffffffbd4;
  params_02.bit_depth = in_stack_fffffffffffffbdc;
  params_02.use_highbd = in_stack_fffffffffffffbe0;
  assertion_result = local_2d8;
  this_01 = pAStack_2d0;
  aom_noise_model_init(in_stack_fffffffffffffbc8,params_02);
  iVar3 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  this_00 = &local_3b8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             &this_00->success_,(type *)0x5a1760);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               in_stack_fffffffffffffc10);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbdc,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),iVar3,
               (char *)in_stack_fffffffffffffbc0);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffbb0));
    std::__cxx11::string::~string(local_408);
    testing::Message::~Message((Message *)0x5a1825);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5a1894);
  return;
}

Assistant:

TEST(NoiseModel, InitFailsWithInvalidBitdepth) {
  aom_noise_model_t model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 2, 8, 0 };
  for (int i = 0; i <= 32; ++i) {
    params.bit_depth = i;
    if (i == 8 || i == 10 || i == 12) {
      EXPECT_TRUE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
      aom_noise_model_free(&model);
    } else {
      EXPECT_FALSE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
    }
  }
  params.bit_depth = INT_MAX;
  EXPECT_FALSE(aom_noise_model_init(&model, params));
}